

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

void __thiscall
lossless_neural_sound::expression_compiler::expression::Expression_node::Code_writing_state::
write_variable_assignment
          (Code_writing_state *this,ostream *os,string *variable,Expression_node *value)

{
  ostream *poVar1;
  string *psVar2;
  
  poVar1 = std::operator<<(os,(string *)&(this->options).indent);
  poVar1 = std::operator<<(poVar1,(string *)variable);
  poVar1 = std::operator<<(poVar1," = ");
  psVar2 = get_variable_name_abi_cxx11_(this,value);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,";\n");
  return;
}

Assistant:

void write_variable_assignment(std::ostream &os,
                                       const std::string &variable,
                                       const Expression_node *value)
        {
            os << options.indent << variable << " = " << get_variable_name(value) << ";\n";
        }